

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O1

ChannelList *
anon_unknown.dwarf_285dd0::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Channel *pCVar6;
  Slice *pSVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  long *plVar16;
  int iVar17;
  PixelType PVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  vector<char,_std::allocator<char>_> *this;
  int iVar22;
  char *pcVar23;
  uint uVar24;
  undefined4 *puVar25;
  undefined4 *puVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  Channel local_68 [56];
  
  piVar11 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = *piVar11;
  iVar3 = piVar11[1];
  iVar20 = piVar11[2];
  lVar19 = 0;
  if (*channels == (char *)0x0) {
    bVar15 = false;
    iVar9 = 0;
    uVar21 = 0;
  }
  else {
    iVar9 = 0;
    bVar15 = false;
    uVar13 = 0;
    do {
      if (pt == (PixelType *)0x0) {
LAB_00194b57:
        iVar9 = iVar9 + 2;
      }
      else {
        PVar18 = pt[uVar13];
        if ((PVar18 != UINT) && (PVar18 != FLOAT)) {
          if (PVar18 == HALF) goto LAB_00194b57;
          goto LAB_00194fe6;
        }
        iVar9 = iVar9 + (-iVar9 & 3U) + 4;
        bVar15 = true;
      }
      uVar21 = uVar13 + 1;
      lVar8 = uVar13 + 1;
      uVar13 = uVar21;
    } while (channels[lVar8] != (char *)0x0);
  }
  iVar22 = (int)uVar21;
  uVar21 = uVar21 & 0xffffffff;
  if (passivechannels == (char **)0x0) {
LAB_00194be7:
    uVar24 = -iVar9 & 3;
    if (!bVar15) {
      uVar24 = 0;
    }
    iVar9 = uVar24 + iVar9;
    uVar24 = (int)lVar19 + iVar22;
    lVar19 = Imf_3_2::Header::dataWindow();
    iVar17 = *(int *)(lVar19 + 8);
    piVar11 = (int *)Imf_3_2::Header::dataWindow();
    iVar4 = *piVar11;
    lVar19 = Imf_3_2::Header::dataWindow();
    iVar5 = *(int *)(lVar19 + 0xc);
    lVar19 = Imf_3_2::Header::dataWindow();
    iVar17 = ((iVar17 - iVar4) + 1) * uVar24 * ((iVar5 - *(int *)(lVar19 + 4)) + 1);
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
    if (writing) {
      this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
    }
    std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar17 * iVar9));
    if (0 < iVar17) {
      puVar12 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        puVar12 = &(anonymous_namespace)::writingBuffer;
      }
      puVar25 = (undefined4 *)*puVar12;
      uVar28 = 0;
      do {
        uVar10 = random_int(0xffff);
        if ((pt == (PixelType *)0x0) || (pt[(int)uVar28] == HALF)) {
          *(short *)puVar25 = (short)uVar10;
          puVar25 = (undefined4 *)((long)puVar25 + 2);
        }
        else {
          puVar26 = (undefined4 *)((long)puVar25 + (ulong)(-(int)puVar25 & 3));
          puVar25 = puVar26 + 1;
          *puVar26 = *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar10 & 0xffff) * 4);
        }
        uVar28 = uVar28 + 1;
        if (uVar28 == uVar24) {
          uVar28 = 0;
        }
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
    if (!writing) {
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
                 (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
    }
    p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar20 = iVar9 * ((iVar20 - iVar2) + 1);
    if (uVar24 != 0) {
      uVar13 = (ulong)(iVar9 / banks);
      uVar14 = (ulong)iVar20;
      uVar27 = 0;
      pcVar23 = (char *)0x0;
      do {
        PVar18 = HALF;
        if (pt != (PixelType *)0x0) {
          PVar18 = pt[uVar27];
        }
        if (uVar27 < uVar21 && writing) {
          pCVar6 = (Channel *)channels[uVar27];
          Imf_3_2::Channel::Channel(local_68,PVar18,1,1,false);
          Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,pCVar6);
        }
        uVar28 = (int)uVar27 >> 0x1f;
        if ((int)((long)((ulong)uVar28 << 0x20 | uVar27 & 0xffffffff) % (long)((int)uVar24 / banks))
            == 0) {
          plVar16 = &(anonymous_namespace)::readingBuffer;
          if (writing) {
            plVar16 = &(anonymous_namespace)::writingBuffer;
          }
          pcVar23 = (char *)(((long)((int)((long)((ulong)uVar28 << 0x20 | uVar27 & 0xffffffff) /
                                          (long)((int)uVar24 / banks)) * (iVar20 / banks)) +
                             *plVar16) - (long)(iVar3 * iVar20 + iVar2 * (iVar9 / banks)));
        }
        uVar29 = (ulong)(-(int)pcVar23 & 3);
        if ((PVar18 & ~FLOAT) != UINT) {
          uVar29 = 0;
        }
        pcVar23 = pcVar23 + uVar29;
        if (uVar27 < uVar21) {
          pSVar7 = (Slice *)channels[uVar27];
          Imf_3_2::Slice::Slice
                    ((Slice *)local_68,PVar18,pcVar23,uVar13,uVar14,1,1,(double)((int)uVar27 + 100),
                     false,false);
          Imf_3_2::FrameBuffer::insert((char *)buf,pSVar7);
        }
        else if (!writing) {
          pSVar7 = (Slice *)passivechannels[uVar27 - (long)iVar22];
          Imf_3_2::Slice::Slice((Slice *)local_68,PVar18,pcVar23,uVar13,uVar14,1,1,0.4,false,false);
          Imf_3_2::FrameBuffer::insert((char *)postreadbuf,pSVar7);
          pSVar7 = (Slice *)passivechannels[uVar27 - (long)iVar22];
          Imf_3_2::Slice::Slice
                    ((Slice *)local_68,PVar18,
                     pcVar23 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                               (anonymous_namespace)::readingBuffer),uVar13,uVar14,1,1,0.4,false,
                     false);
          Imf_3_2::FrameBuffer::insert((char *)prereadbuf,pSVar7);
        }
        lVar19 = 2;
        if (PVar18 != HALF) {
          if (PVar18 != FLOAT) {
            std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
            goto LAB_00194ff9;
          }
          lVar19 = 4;
        }
        pcVar23 = pcVar23 + lVar19;
        uVar27 = uVar27 + 1;
      } while (uVar24 != uVar27);
    }
    return __return_storage_ptr__;
  }
  lVar19 = 0;
LAB_00194bab:
  if (passivechannels[lVar19] == (char *)0x0) goto LAB_00194be7;
  if (pt == (PixelType *)0x0) {
LAB_00194bcc:
    iVar9 = iVar9 + 2;
  }
  else {
    PVar18 = pt[uVar21 + lVar19];
    if ((PVar18 != UINT) && (PVar18 != FLOAT)) {
      if (PVar18 == HALF) goto LAB_00194bcc;
LAB_00194fe6:
      std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_00194ff9:
      exit(1);
    }
    iVar9 = iVar9 + (-iVar9 & 3U) + 4;
    bVar15 = true;
  }
  lVar19 = lVar19 + 1;
  if (passivechannels == (char **)0x0) goto LAB_00194be7;
  goto LAB_00194bab;
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const char* const*
        passivechannels,  // NULL terminated list of channels to write
    const PixelType* pt,  // type of each channel, or NULL for all HALF
    FrameBuffer&     buf, // buffer to fill with pointers to channel
    FrameBuffer&
        prereadbuf, // channels which aren't being read - indexes into the preread buffer
    FrameBuffer&
         postreadbuf, // channels which aren't being read - indexes into the postread buffer
    int  banks, // number of banks - channels within each bank are interleaved, banks are scanline interleaved
    bool writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    int  activechans     = 0;
    int  bytes_per_pixel = 0;
    bool has32BitValue   = false;
    while (channels[activechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;

                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        activechans++;
    }

    int passivechans = 0;
    while (passivechannels != NULL && passivechannels[passivechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[passivechans + activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;
                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        passivechans++;
    }

    if (has32BitValue) { bytes_per_pixel = alignToFour (bytes_per_pixel); }

    int chans = activechans + passivechans;

    int bytes_per_bank = bytes_per_pixel / banks;

    int samples = (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
                  (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
                  chans;

    int size = samples * bytes_per_pixel;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels
    int chan = 0;
    for (int i = 0; i < samples; i++)
    {
        unsigned short int values =
            random_int (std::numeric_limits<unsigned short>::max ());
        half v;
        v.setBits (values);
        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
            write_ptr += 2;
        }
        else
        {
            write_ptr           = alignToFour (write_ptr);
            *(float*) write_ptr = float (v);

            write_ptr += 4;
        }
        chan++;
        if (chan == chans) { chan = 0; }
    }

    if (!writing)
    {
        //take a copy of the buffer as it was before being read
        preReadBuffer = readingBuffer;
    }

    char* offset = NULL;

    ChannelList chanlist;

    int bytes_per_row      = bytes_per_pixel * (dw.max.x + 1 - dw.min.x);
    int bytes_per_bank_row = bytes_per_row / banks;

    int first_pixel_index =
        bytes_per_row * dw.min.y + bytes_per_bank * dw.min.x;

    for (int i = 0; i < chans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];
        if (i < activechans && writing) { chanlist.insert (channels[i], type); }

        if (i % (chans / banks) == 0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans / banks);
            offset   = (writing ? &writingBuffer[0] : &readingBuffer[0]) +
                     bank * bytes_per_bank_row - first_pixel_index;
        }

        if (type == FLOAT || type == UINT) { offset = alignToFour (offset); }

        if (i < activechans)
        {

            buf.insert (
                channels[i],
                Slice (
                    type,
                    offset,
                    bytes_per_bank,
                    bytes_per_row,
                    1,
                    1,
                    100 + i));
        }
        else
        {
            if (!writing)
            {

                postreadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));

                char* pre_offset =
                    offset - &readingBuffer[0] + &preReadBuffer[0];

                prereadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        pre_offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF: offset += 2; break;
            case IMF::FLOAT: offset += 4; break;
            default: cout << "Unexpected Pixel Type\n"; exit (1);
        }
    }

    return chanlist;
}